

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O1

void btPolyhedralContactClipping::clipHullAgainstHull
               (btVector3 *separatingNormal1,btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,
               btTransform *transA,btTransform *transB,btScalar minDist,btScalar maxDist,
               Result *resultOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  int iVar8;
  btFace *pbVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  btVector3 *pbVar12;
  btScalar *pbVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  btVertexArray worldVertsB1;
  btVector3 separatingNormal;
  btVertexArray local_150;
  btScalar local_130;
  btScalar local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  btVector3 local_108;
  undefined1 local_f8 [16];
  btConvexPolyhedron *local_e0;
  btTransform *local_d8;
  Result *local_d0;
  long local_c8;
  btConvexPolyhedron *local_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar11 = *(ulong *)separatingNormal1->m_floats;
  local_108.m_floats[0] = (btScalar)uVar11;
  local_108.m_floats[1] = (btScalar)(uVar11 >> 0x20);
  uVar7 = *(undefined8 *)(separatingNormal1->m_floats + 2);
  local_108.m_floats[2] = (btScalar)uVar7;
  fVar20 = local_108.m_floats[2] * local_108.m_floats[2] +
           local_108.m_floats[0] * local_108.m_floats[0] +
           local_108.m_floats[1] * local_108.m_floats[1];
  local_130 = minDist;
  local_12c = maxDist;
  local_e0 = hullA;
  local_d8 = transA;
  local_d0 = resultOut;
  if (fVar20 < 0.0) {
    local_118._8_8_ = 0;
    local_118._0_8_ = uVar11;
    uStack_120 = 0;
    local_128 = uVar7;
    fVar20 = sqrtf(fVar20);
    local_108.m_floats[0] = (btScalar)local_118._0_4_;
    local_108.m_floats[1] = (btScalar)local_118._4_4_;
    local_108.m_floats[2] = (float)local_128;
    local_108.m_floats[3] = local_128._4_4_;
  }
  else {
    fVar20 = SQRT(fVar20);
    local_108.m_floats[3] = (btScalar)((ulong)uVar7 >> 0x20);
  }
  fVar20 = 1.0 / fVar20;
  local_108.m_floats[2] = local_108.m_floats[2] * fVar20;
  local_108.m_floats[0] = local_108.m_floats[0] * fVar20;
  local_108.m_floats[1] = local_108.m_floats[1] * fVar20;
  uVar11 = (ulong)(hullB->m_faces).m_size;
  if ((long)uVar11 < 1) {
    iVar16 = -1;
  }
  else {
    fVar20 = (transB->m_basis).m_el[0].m_floats[0];
    local_118._0_4_ = fVar20;
    fVar3 = (transB->m_basis).m_el[0].m_floats[1];
    local_128 = CONCAT44(local_128._4_4_,fVar3);
    fVar4 = (transB->m_basis).m_el[0].m_floats[2];
    local_f8._0_4_ = fVar4;
    pbVar13 = ((hullB->m_faces).m_data)->m_plane + 2;
    fVar21 = -3.4028235e+38;
    uVar17 = 0xffffffff;
    uVar14 = 0;
    do {
      fVar22 = pbVar13[-2];
      fVar5 = pbVar13[-1];
      fVar6 = *pbVar13;
      fVar22 = (fVar6 * (transB->m_basis).m_el[2].m_floats[2] +
               fVar22 * (transB->m_basis).m_el[2].m_floats[0] +
               fVar5 * (transB->m_basis).m_el[2].m_floats[1]) * local_108.m_floats[2] +
               ((transB->m_basis).m_el[1].m_floats[2] * fVar6 +
               (transB->m_basis).m_el[1].m_floats[0] * fVar22 +
               fVar5 * (transB->m_basis).m_el[1].m_floats[1]) * local_108.m_floats[1] +
               (fVar4 * fVar6 + fVar20 * fVar22 + fVar5 * fVar3) * local_108.m_floats[0];
      if (fVar21 < fVar22) {
        uVar17 = uVar14 & 0xffffffff;
        fVar21 = fVar22;
      }
      iVar16 = (int)uVar17;
      uVar14 = uVar14 + 1;
      pbVar13 = pbVar13 + 0xc;
    } while (uVar11 != uVar14);
  }
  local_150.m_data = (btVector3 *)0x0;
  local_150.m_size = 0;
  local_150.m_capacity = 0;
  pbVar9 = (hullB->m_faces).m_data;
  lVar15 = (long)pbVar9[iVar16].m_indices.m_size;
  if (0 < lVar15) {
    lVar18 = 0;
    local_c8 = lVar15;
    local_c0 = hullB;
    do {
      local_150.m_ownsMemory = true;
      iVar8 = pbVar9[iVar16].m_indices.m_data[lVar18];
      pbVar12 = (hullB->m_vertices).m_data;
      local_68 = *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
      uStack_60 = *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 2);
      local_a8 = *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 1);
      uStack_a0 = *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 3);
      local_128 = *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 2);
      uStack_120 = *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
      local_88 = ZEXT416((uint)pbVar12[iVar8].m_floats[1]);
      local_58 = ZEXT416((uint)pbVar12[iVar8].m_floats[0]);
      local_118 = ZEXT416((uint)pbVar12[iVar8].m_floats[2]);
      local_b8 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[1]);
      local_78 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]);
      local_48 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]);
      local_f8 = ZEXT416((uint)((transB->m_basis).m_el[2].m_floats[2] * pbVar12[iVar8].m_floats[2] +
                                (transB->m_basis).m_el[2].m_floats[0] * pbVar12[iVar8].m_floats[0] +
                                (transB->m_basis).m_el[2].m_floats[1] * pbVar12[iVar8].m_floats[1] +
                               (transB->m_origin).m_floats[2]));
      local_98 = *(undefined8 *)(transB->m_origin).m_floats;
      uStack_90 = 0;
      pbVar12 = local_150.m_data;
      iVar8 = local_150.m_capacity;
      if (local_150.m_size == local_150.m_capacity) {
        iVar19 = local_150.m_size * 2;
        if (local_150.m_size == 0) {
          iVar19 = 1;
        }
        if (local_150.m_capacity < iVar19) {
          if (iVar19 == 0) {
            pbVar12 = (btVector3 *)0x0;
          }
          else {
            pbVar12 = (btVector3 *)btAlignedAllocInternal((long)iVar19 << 4,0x10);
          }
          if (0 < (long)local_150.m_size) {
            lVar15 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_150.m_data)->m_floats + lVar15);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar12->m_floats + lVar15);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              lVar15 = lVar15 + 0x10;
            } while ((long)local_150.m_size * 0x10 != lVar15);
          }
          lVar15 = local_c8;
          hullB = local_c0;
          iVar8 = iVar19;
          if ((local_150.m_data != (btVector3 *)0x0) && (local_150.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_150.m_data);
            lVar15 = local_c8;
            hullB = local_c0;
          }
        }
      }
      local_150.m_capacity = iVar8;
      local_150.m_data = pbVar12;
      auVar10._4_4_ =
           (float)local_48._0_4_ * (float)local_118._0_4_ +
           (float)local_78._0_4_ * (float)local_58._0_4_ +
           (float)local_b8._0_4_ * (float)local_88._0_4_ + local_98._4_4_;
      auVar10._0_4_ =
           (float)local_128 * (float)local_118._0_4_ +
           (float)local_68 * (float)local_58._0_4_ + (float)local_a8 * (float)local_88._0_4_ +
           (float)local_98;
      auVar10._8_4_ = local_f8._0_4_;
      auVar10._12_4_ = 0;
      *(undefined1 (*) [16])local_150.m_data[local_150.m_size].m_floats = auVar10;
      local_150.m_size = local_150.m_size + 1;
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar15);
  }
  local_150.m_ownsMemory = true;
  if (-1 < iVar16) {
    clipFaceAgainstHull(&local_108,local_e0,local_d8,&local_150,local_130,local_12c,local_d0);
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_150);
  return;
}

Assistant:

void	btPolyhedralContactClipping::clipHullAgainstHull(const btVector3& separatingNormal1, const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, const btScalar minDist, btScalar maxDist,btDiscreteCollisionDetectorInterface::Result& resultOut)
{

	btVector3 separatingNormal = separatingNormal1.normalized();
//	const btVector3 c0 = transA * hullA.m_localCenter;
//	const btVector3 c1 = transB * hullB.m_localCenter;
	//const btVector3 DeltaC2 = c0 - c1;



	int closestFaceB=-1;
	btScalar dmax = -FLT_MAX;
	{
		for(int face=0;face<hullB.m_faces.size();face++)
		{
			const btVector3 Normal(hullB.m_faces[face].m_plane[0], hullB.m_faces[face].m_plane[1], hullB.m_faces[face].m_plane[2]);
			const btVector3 WorldNormal = transB.getBasis() * Normal;
			btScalar d = WorldNormal.dot(separatingNormal);
			if (d > dmax)
			{
				dmax = d;
				closestFaceB = face;
			}
		}
	}
				btVertexArray worldVertsB1;
				{
					const btFace& polyB = hullB.m_faces[closestFaceB];
					const int numVertices = polyB.m_indices.size();
					for(int e0=0;e0<numVertices;e0++)
					{
						const btVector3& b = hullB.m_vertices[polyB.m_indices[e0]];
						worldVertsB1.push_back(transB*b);
					}
				}

	
	if (closestFaceB>=0)
		clipFaceAgainstHull(separatingNormal, hullA, transA,worldVertsB1, minDist, maxDist,resultOut);

}